

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinExtVar
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  bool bVar1;
  const_reference pvVar2;
  undefined8 uVar3;
  pointer ppVar4;
  AST *ast;
  allocator_type *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  Value VVar5;
  Tokens *in_stack_00000018;
  Allocator *in_stack_00000020;
  AST *expr;
  Tokens tokens;
  string filename;
  VmExt *ext;
  string msg;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_00000118;
  iterator it;
  string var8;
  UString *var;
  char *in_stack_00000a70;
  string *in_stack_00000a78;
  UString *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  Interpreter *in_stack_fffffffffffffe38;
  Allocator *in_stack_fffffffffffffe40;
  allocator_type *__a;
  allocator<char> *in_stack_fffffffffffffe60;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *this_00;
  allocator<char> *__lhs;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  string local_128 [32];
  string local_108 [32];
  VmExt *local_e8;
  _Self local_c0;
  _Self local_b8;
  UString local_b0;
  HeapEntity *local_90;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_85 [2];
  allocator<char> local_41;
  string local_40 [32];
  allocator_type *local_20;
  AST *local_8;
  
  __lhs = &local_41;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)in_RDI,in_stack_fffffffffffffe60);
  local_85[0].
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ._M_impl.super__Vector_impl_data._M_start._1_4_ = 0x13;
  local_85[0].
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ._M_impl.super__Vector_impl_data._5_8_ =
       (long)&local_85[0].
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
  local_85[0].
  super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ._M_impl.super__Vector_impl_data._13_8_ = 1;
  this_00 = local_85;
  __a = local_20;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d7dbc);
  __l._M_len = (size_type)in_RSI;
  __l._M_array = (iterator)in_RDI;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(this_00,__l,__a);
  validateBuiltinArgs((Interpreter *)var8._M_string_length,(LocationRange *)var8._0_8_,
                      (string *)it._M_node,in_stack_00000118,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)msg.field_2._8_8_);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)in_stack_fffffffffffffe40);
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d7e20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                         *)local_20,0);
  local_90 = (pvVar2->v).h + 1;
  encode_utf8(&local_b0);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
               *)in_stack_fffffffffffffe28,(key_type *)0x2d7e8b);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
              *)in_stack_fffffffffffffe28);
  bVar1 = std::operator==(&local_b8,&local_c0);
  if (!bVar1) {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>
                           *)0x2d8027);
    local_e8 = &ppVar4->second;
    if (((ppVar4->second).isCode & 1U) == 0) {
      decode_utf8(in_RDI);
      VVar5 = makeString((Interpreter *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28);
      *(ulong *)(in_RDI + 2) = CONCAT44(in_stack_fffffffffffffea4,VVar5.t);
      in_RDI[2]._M_string_length = (size_type)VVar5.v;
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 CONCAT44(VVar5.t,in_stack_fffffffffffffe30));
      local_8 = (AST *)0x0;
    }
    else {
      std::operator+((char *)__lhs,in_RSI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe38,
                     (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::c_str();
      jsonnet_lex(in_stack_00000a78,in_stack_00000a70);
      ast = jsonnet_parse(in_stack_00000020,in_stack_00000018);
      jsonnet_desugar(in_stack_fffffffffffffe40,(AST **)ast,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      jsonnet_static_analysis((AST *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      Stack::pop((Stack *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      local_8 = ast;
      std::__cxx11::list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::~list
                ((list<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
                 0x2d8142);
      std::__cxx11::string::~string(local_108);
    }
    std::__cxx11::string::~string((string *)&local_b0);
    return local_8;
  }
  std::operator+((char *)__lhs,in_RSI);
  uVar3 = __cxa_allocate_exception(0x38);
  makeError(in_stack_fffffffffffffe38,
            (LocationRange *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
            (string *)in_stack_fffffffffffffe28);
  __cxa_throw(uVar3,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinExtVar(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "extVar", args, {Value::STRING});
        const UString &var = static_cast<HeapString *>(args[0].v.h)->value;
        std::string var8 = encode_utf8(var);
        auto it = externalVars.find(var8);
        if (it == externalVars.end()) {
            std::string msg = "undefined external variable: " + var8;
            throw makeError(loc, msg);
        }
        const VmExt &ext = it->second;
        if (ext.isCode) {
            std::string filename = "<extvar:" + var8 + ">";
            Tokens tokens = jsonnet_lex(filename, ext.data.c_str());
            AST *expr = jsonnet_parse(alloc, tokens);
            jsonnet_desugar(alloc, expr, nullptr);
            jsonnet_static_analysis(expr);
            stack.pop();
            return expr;
        } else {
            scratch = makeString(decode_utf8(ext.data));
            return nullptr;
        }
    }